

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-base.h
# Opt level: O3

ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&> * __thiscall
mp::pre::ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>::operator=
          (ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&> *this,
          ValueMap<std::vector<int,_std::allocator<int>_>,_int> *m)

{
  _Base_ptr p_Var1;
  long lVar2;
  _Rb_tree_iterator<std::pair<const_int,_mp::pre::ValueNode>_> _Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_mp::pre::ValueNode>_>,_bool> pVar6;
  vector<int,_std::allocator<int>_> local_168;
  string local_148;
  pair<const_int,_mp::pre::ValueNode> local_128;
  ValueNode local_a8;
  
  p_Var4 = (m->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(m->map_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var5) {
    do {
      std::vector<int,_std::allocator<int>_>::vector
                (&local_168,(vector<int,_std::allocator<int>_> *)&p_Var4[1]._M_parent);
      local_148._M_string_length = 0;
      local_148.field_2._M_local_buf[0] = '\0';
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      ValueNode::ValueNode(&local_a8,*(BasicValuePresolver **)this,&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,
                        CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                 local_148.field_2._M_local_buf[0]) + 1);
      }
      local_128.first = p_Var4[1]._M_color;
      ValueNode::ValueNode(&local_128.second,&local_a8);
      pVar6 = std::
              _Rb_tree<int,std::pair<int_const,mp::pre::ValueNode>,std::_Select1st<std::pair<int_const,mp::pre::ValueNode>>,std::less<int>,std::allocator<std::pair<int_const,mp::pre::ValueNode>>>
              ::_M_insert_unique<std::pair<int_const,mp::pre::ValueNode>>
                        ((_Rb_tree<int,std::pair<int_const,mp::pre::ValueNode>,std::_Select1st<std::pair<int_const,mp::pre::ValueNode>>,std::less<int>,std::allocator<std::pair<int_const,mp::pre::ValueNode>>>
                          *)(this + 0x28),&local_128);
      _Var3 = pVar6.first._M_node;
      p_Var1 = _Var3._M_node[1]._M_left;
      lVar2 = *(long *)(_Var3._M_node + 2);
      _Var3._M_node[1]._M_left =
           (_Base_ptr)
           local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
      _Var3._M_node[1]._M_right =
           (_Base_ptr)
           local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      *(pointer *)(_Var3._M_node + 2) =
           local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (p_Var1 != (_Base_ptr)0x0) {
        operator_delete(p_Var1,lVar2 - (long)p_Var1);
      }
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&_Var3._M_node[1]._M_left,
                 (size_type)_Var3._M_node[3]._M_right);
      ValueNode::~ValueNode(&local_128.second);
      ValueNode::~ValueNode(&local_a8);
      if ((_Base_ptr)
          local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (_Base_ptr)0x0) {
        operator_delete(local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  }
  return (ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&> *)this;
}

Assistant:

ValueMap& operator=(const ValueMap<Array2>& m) {
    for (const auto& a2: m.GetMap())
      map_.insert({
                    a2.first, CreateArray<Array, Param>(prm_)
                  }).first->second =
          a2.second;
    return *this;
  }